

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::GetObservationProbability
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Index in_stack_000000c4;
  Index in_stack_000000c8;
  Index in_stack_000000cc;
  TransitionObservationIndependentMADPDiscrete *in_stack_000000d0;
  
  GetObservationProbability(in_stack_000000d0,in_stack_000000cc,in_stack_000000c8,in_stack_000000c4)
  ;
  return;
}

Assistant:

double TransitionObservationIndependentMADPDiscrete::
GetObservationProbability(Index jaI,
                          Index sucSI, 
                          Index joI) const
{
    double p=1;
    if(!_m_jointModelsGenerated)
    {
        vector<Index> sucSIs=JointToIndividualStateIndices(sucSI);
        vector<Index> aIs=JointToIndividualActionIndices(jaI);
        vector<Index> oIs=JointToIndividualObservationIndices(joI);
        for(Index agI = 0; agI < GetNrAgents(); agI++)
        {
            p*=GetIndividualMADPD(agI)->GetObservationProbability(
                aIs[agI],
                sucSIs[agI],
                oIs[agI]);
            if(p==0)
                break;
        }
    }
    else
    {
        for(Index agI = 0; agI < GetNrAgents(); agI++)
        {
            p*=GetIndividualMADPD(agI)->GetObservationProbability(
                _m_jointToIndActionCache[jaI][agI],
                _m_indivStateIndices[sucSI][agI],
                _m_jointToIndObsCache[joI][agI]);
            if(p==0)
                break;
        }
    }
    return(p);
}